

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall ViewTest::shiftOperatorTest<false,(andres::CoordinateOrder)1>(ViewTest *this)

{
  allocator<int> *paVar1;
  undefined1 *this_00;
  int iVar2;
  reference pvVar3;
  iterator iVar4;
  iterator iVar5;
  reference piVar6;
  bool local_618;
  bool local_617;
  bool local_616;
  bool local_615;
  bool local_614;
  bool local_613;
  bool local_612;
  bool local_611;
  ulong local_610;
  size_t z;
  size_t y_1;
  size_t x_1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_5f0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_5e8;
  undefined1 local_5e0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w8;
  undefined1 local_588 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w7;
  undefined1 local_530 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w6_1;
  undefined1 local_4d8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w5_1;
  undefined1 local_480 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w4_1;
  undefined1 local_428 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w3_1;
  undefined1 local_3d0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w2_1;
  undefined1 local_378 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w1_1;
  undefined1 local_320 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_1;
  undefined1 local_2d8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  ulong local_2b8;
  size_t y;
  size_t x;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_2a0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_298;
  undefined1 local_290 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w6;
  undefined1 local_238 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w5;
  undefined1 local_1e0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w4;
  undefined1 local_188 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w3;
  undefined1 local_130 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w2;
  undefined1 local_d8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w1;
  undefined1 local_80 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v;
  allocator<unsigned_long> local_29;
  undefined1 local_28 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  ViewTest *this_local;
  
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_long>::allocator(&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,2,&local_29);
  std::allocator<unsigned_long>::~allocator(&local_29);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,0);
  *pvVar3 = 6;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,1);
  *pvVar3 = 4;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  w1.geometry_.isSimple_ = true;
  w1.geometry_._53_3_ = 0;
  paVar1 = (allocator<int> *)((long)&w1.geometry_.coordinateOrder_ + 3);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_80,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,(CoordinateOrder *)&w1.geometry_.isSimple_,
             &andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator((allocator<int> *)((long)&w1.geometry_.coordinateOrder_ + 3));
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  w2.geometry_.isSimple_ = true;
  w2.geometry_._53_3_ = 0;
  paVar1 = (allocator<int> *)((long)&w2.geometry_.coordinateOrder_ + 3);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_d8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,(CoordinateOrder *)&w2.geometry_.isSimple_,
             &andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator((allocator<int> *)((long)&w2.geometry_.coordinateOrder_ + 3));
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  w3.geometry_.isSimple_ = true;
  w3.geometry_._53_3_ = 0;
  paVar1 = (allocator<int> *)((long)&w3.geometry_.coordinateOrder_ + 3);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_130,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,(CoordinateOrder *)&w3.geometry_.isSimple_,
             &andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator((allocator<int> *)((long)&w3.geometry_.coordinateOrder_ + 3));
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  w4.geometry_.isSimple_ = true;
  w4.geometry_._53_3_ = 0;
  paVar1 = (allocator<int> *)((long)&w4.geometry_.coordinateOrder_ + 3);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_188,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,(CoordinateOrder *)&w4.geometry_.isSimple_,
             &andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator((allocator<int> *)((long)&w4.geometry_.coordinateOrder_ + 3));
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  w5.geometry_.isSimple_ = true;
  w5.geometry_._53_3_ = 0;
  paVar1 = (allocator<int> *)((long)&w5.geometry_.coordinateOrder_ + 3);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_1e0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,(CoordinateOrder *)&w5.geometry_.isSimple_,
             &andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator((allocator<int> *)((long)&w5.geometry_.coordinateOrder_ + 3));
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  w6.geometry_.isSimple_ = true;
  w6.geometry_._53_3_ = 0;
  paVar1 = (allocator<int> *)((long)&w6.geometry_.coordinateOrder_ + 3);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_238,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,(CoordinateOrder *)&w6.geometry_.isSimple_,
             &andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator((allocator<int> *)((long)&w6.geometry_.coordinateOrder_ + 3));
  local_298._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  local_2a0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  x._4_4_ = 1;
  std::allocator<int>::allocator((allocator<int> *)((long)&x + 3));
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_290,local_298,local_2a0,
             this->data_,(CoordinateOrder *)((long)&x + 4),&andres::defaultOrder,
             (allocator<int> *)((long)&x + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&x + 3));
  andres::View<int,_false,_std::allocator<unsigned_long>_>::shift
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8,1);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::shift
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_130,2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::shift
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_188,3);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::shift
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1e0,-1);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::shift
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_238,-2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::shift
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_290,-3);
  for (y = 0; y < 6; y = y + 1) {
    for (local_2b8 = 0; local_2b8 < 4; local_2b8 = local_2b8 + 1) {
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_80,y,local_2b8);
      iVar2 = *piVar6;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_d8,local_2b8,y);
      shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = iVar2 == *piVar6;
      test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_80,y,local_2b8);
      iVar2 = *piVar6;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_130,y,local_2b8);
      shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = iVar2 == *piVar6;
      test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_80,y,local_2b8);
      iVar2 = *piVar6;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_188,local_2b8,y);
      shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = iVar2 == *piVar6;
      test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_80,y,local_2b8);
      iVar2 = *piVar6;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_1e0,local_2b8,y);
      shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_1_ = iVar2 == *piVar6;
      test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_80,y,local_2b8);
      iVar2 = *piVar6;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_238,y,local_2b8);
      shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = iVar2 == *piVar6;
      test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_80,y,local_2b8);
      iVar2 = *piVar6;
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_290,local_2b8,y);
      shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_1_ = iVar2 == *piVar6;
      test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
    }
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_290);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_238);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1e0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_188);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_130);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  this_00 = &v_1.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8,3,
             (allocator_type *)this_00);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_1.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8,0);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8,1);
  *pvVar3 = 4;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8,2);
  *pvVar3 = 2;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  w1_1.geometry_.isSimple_ = true;
  w1_1.geometry_._53_3_ = 0;
  paVar1 = (allocator<int> *)((long)&w1_1.geometry_.coordinateOrder_ + 3);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_320,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,(CoordinateOrder *)&w1_1.geometry_.isSimple_,
             &andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator((allocator<int> *)((long)&w1_1.geometry_.coordinateOrder_ + 3));
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  w2_1.geometry_.isSimple_ = true;
  w2_1.geometry_._53_3_ = 0;
  paVar1 = (allocator<int> *)((long)&w2_1.geometry_.coordinateOrder_ + 3);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_378,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,(CoordinateOrder *)&w2_1.geometry_.isSimple_,
             &andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator((allocator<int> *)((long)&w2_1.geometry_.coordinateOrder_ + 3));
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  w3_1.geometry_.isSimple_ = true;
  w3_1.geometry_._53_3_ = 0;
  paVar1 = (allocator<int> *)((long)&w3_1.geometry_.coordinateOrder_ + 3);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_3d0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,(CoordinateOrder *)&w3_1.geometry_.isSimple_,
             &andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator((allocator<int> *)((long)&w3_1.geometry_.coordinateOrder_ + 3));
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  w4_1.geometry_.isSimple_ = true;
  w4_1.geometry_._53_3_ = 0;
  paVar1 = (allocator<int> *)((long)&w4_1.geometry_.coordinateOrder_ + 3);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_428,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,(CoordinateOrder *)&w4_1.geometry_.isSimple_,
             &andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator((allocator<int> *)((long)&w4_1.geometry_.coordinateOrder_ + 3));
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  w5_1.geometry_.isSimple_ = true;
  w5_1.geometry_._53_3_ = 0;
  paVar1 = (allocator<int> *)((long)&w5_1.geometry_.coordinateOrder_ + 3);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_480,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,(CoordinateOrder *)&w5_1.geometry_.isSimple_,
             &andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator((allocator<int> *)((long)&w5_1.geometry_.coordinateOrder_ + 3));
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  w6_1.geometry_.isSimple_ = true;
  w6_1.geometry_._53_3_ = 0;
  paVar1 = (allocator<int> *)((long)&w6_1.geometry_.coordinateOrder_ + 3);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_4d8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,(CoordinateOrder *)&w6_1.geometry_.isSimple_,
             &andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator((allocator<int> *)((long)&w6_1.geometry_.coordinateOrder_ + 3));
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  w7.geometry_.isSimple_ = true;
  w7.geometry_._53_3_ = 0;
  paVar1 = (allocator<int> *)((long)&w7.geometry_.coordinateOrder_ + 3);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_530,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,(CoordinateOrder *)&w7.geometry_.isSimple_,
             &andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator((allocator<int> *)((long)&w7.geometry_.coordinateOrder_ + 3));
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  w8.geometry_.isSimple_ = true;
  w8.geometry_._53_3_ = 0;
  paVar1 = (allocator<int> *)((long)&w8.geometry_.coordinateOrder_ + 3);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_588,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,(CoordinateOrder *)&w8.geometry_.isSimple_,
             &andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator((allocator<int> *)((long)&w8.geometry_.coordinateOrder_ + 3));
  local_5e8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  local_5f0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  x_1._4_4_ = 1;
  std::allocator<int>::allocator((allocator<int> *)((long)&x_1 + 3));
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_5e0,local_5e8,local_5f0,
             this->data_,(CoordinateOrder *)((long)&x_1 + 4),&andres::defaultOrder,
             (allocator<int> *)((long)&x_1 + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&x_1 + 3));
  andres::View<int,_false,_std::allocator<unsigned_long>_>::shift
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_378,1);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::shift
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_3d0,2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::shift
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_428,3);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::shift
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_480,4);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::shift
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4d8,-1);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::shift
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_530,-2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::shift
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_588,-3);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::shift
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_5e0,-4);
  for (y_1 = 0; y_1 < 3; y_1 = y_1 + 1) {
    for (z = 0; z < 4; z = z + 1) {
      for (local_610 = 0; local_610 < 2; local_610 = local_610 + 1) {
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_320,y_1,z,
                            local_610);
        iVar2 = *piVar6;
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_378,local_610,y_1
                            ,z);
        local_611 = iVar2 == *piVar6;
        test(&local_611);
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_320,y_1,z,
                            local_610);
        iVar2 = *piVar6;
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_3d0,z,local_610,
                            y_1);
        local_612 = iVar2 == *piVar6;
        test(&local_612);
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_320,y_1,z,
                            local_610);
        iVar2 = *piVar6;
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_428,y_1,z,
                            local_610);
        local_613 = iVar2 == *piVar6;
        test(&local_613);
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_320,y_1,z,
                            local_610);
        iVar2 = *piVar6;
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_480,local_610,y_1
                            ,z);
        local_614 = iVar2 == *piVar6;
        test(&local_614);
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_320,y_1,z,
                            local_610);
        iVar2 = *piVar6;
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_4d8,z,local_610,
                            y_1);
        local_615 = iVar2 == *piVar6;
        test(&local_615);
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_320,y_1,z,
                            local_610);
        iVar2 = *piVar6;
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_530,local_610,y_1
                            ,z);
        local_616 = iVar2 == *piVar6;
        test(&local_616);
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_320,y_1,z,
                            local_610);
        iVar2 = *piVar6;
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_588,y_1,z,
                            local_610);
        local_617 = iVar2 == *piVar6;
        test(&local_617);
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_320,y_1,z,
                            local_610);
        iVar2 = *piVar6;
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_5e0,z,local_610,
                            y_1);
        local_618 = iVar2 == *piVar6;
        test(&local_618);
      }
    }
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_5e0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_588);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_530);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_4d8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_480);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_428);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_3d0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_378);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_320);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8);
  return;
}

Assistant:

void ViewTest::shiftOperatorTest() {
    // 2D
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 6; 
        shape[1] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w3(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w4(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w5(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w6(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        w1.shift(1);
        w2.shift(2);
        w3.shift(3);
        w4.shift(-1);
        w5.shift(-2);
        w6.shift(-3);

        for(std::size_t x=0; x<6; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                test(v(x, y) == w1(y, x));
                test(v(x, y) == w2(x, y));
                test(v(x, y) == w3(y, x));
                test(v(x, y) == w4(y, x));
                test(v(x, y) == w5(x, y));
                test(v(x, y) == w6(y, x));
            }
        }
    }
    // 3D
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3; 
        shape[1] = 4;
        shape[2] = 2;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w3(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w4(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w5(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w6(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w7(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w8(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        w1.shift(1);
        w2.shift(2);
        w3.shift(3);
        w4.shift(4);
        w5.shift(-1);
        w6.shift(-2);
        w7.shift(-3);
        w8.shift(-4);

        for(std::size_t x=0; x<3; ++x) {
            for(std::size_t y=0; y<4; ++y) {

                for(std::size_t z=0; z<2; ++z) {
                    test(v(x, y, z) == w1(z, x, y));
                    test(v(x, y, z) == w2(y, z, x));
                    test(v(x, y, z) == w3(x, y, z));
                    test(v(x, y, z) == w4(z, x, y));
                    test(v(x, y, z) == w5(y, z, x));
                    test(v(x, y, z) == w6(z, x, y));
                    test(v(x, y, z) == w7(x, y, z));
                    test(v(x, y, z) == w8(y, z, x));
                }
            }
        }
    }
}